

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::quadratic_cost_type<long_double>::make_l2_norm
          (quadratic_cost_type<long_double> *this,int n)

{
  longdouble lVar1;
  longdouble *plVar2;
  quad *pqVar3;
  ulong uVar4;
  long lVar5;
  longdouble lVar6;
  long local_18;
  ushort uStack_10;
  
  lVar6 = (longdouble)0;
  if (n != 0) {
    lVar6 = (longdouble)0;
    lVar5 = 0;
    do {
      lVar1 = *(longdouble *)
               ((long)(this->linear_elements)._M_t.
                      super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                      super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                      super__Head_base<0UL,_long_double_*,_false>._M_head_impl + lVar5);
      lVar6 = lVar1 * lVar1 + lVar6;
      lVar5 = lVar5 + 0x10;
    } while ((ulong)(uint)n << 4 != lVar5);
  }
  uVar4 = (ulong)(uint)(this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                       _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl[n];
  if (uVar4 != 0) {
    lVar5 = 0;
    do {
      lVar1 = *(longdouble *)
               ((long)&((this->quadratic_elements)._M_t.
                        super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<long_double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
                        .
                        super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_false>
                       ._M_head_impl)->factor + lVar5);
      lVar6 = lVar1 * lVar1 + lVar6;
      lVar5 = lVar5 + 0x20;
    } while (uVar4 << 5 != lVar5);
  }
  local_18 = SUB108(lVar6,0);
  uStack_10 = (ushort)((unkuint10)lVar6 >> 0x40);
  if ((ushort)((uStack_10 & 0x7fff) - 1) < 0x7ffe && local_18 < 0) {
    if (n != 0) {
      plVar2 = (this->linear_elements)._M_t.
               super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
               super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
               super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
      lVar5 = 0;
      do {
        *(longdouble *)((long)plVar2 + lVar5) = *(longdouble *)((long)plVar2 + lVar5) / lVar6;
        lVar5 = lVar5 + 0x10;
      } while ((ulong)(uint)n << 4 != lVar5);
    }
    if (uVar4 != 0) {
      pqVar3 = (this->quadratic_elements)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<long_double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_false>
               ._M_head_impl;
      lVar5 = 0;
      do {
        *(longdouble *)((long)&pqVar3->factor + lVar5) =
             *(longdouble *)((long)&pqVar3->factor + lVar5) / lVar6;
        lVar5 = lVar5 + 0x20;
      } while (uVar4 << 5 != lVar5);
    }
  }
  return;
}

Assistant:

void make_l2_norm(int n)
    {
        Float div = { 0 };

        for (int i = 0; i != n; ++i)
            div += linear_elements[i] * linear_elements[i];
        ;

        for (int i = 0, e = indices[n]; i != e; ++i)
            div += quadratic_elements[i].factor * quadratic_elements[i].factor;

        if (std::isnormal(div)) {
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;

            for (int i = 0, e = indices[n]; i != e; ++i)
                quadratic_elements[i].factor /= div;
        }
    }